

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::PreSelectedInputs> *
wallet::FetchSelectedInputs
          (Result<wallet::PreSelectedInputs> *__return_storage_ptr__,CWallet *wallet,
          CCoinControl *coin_control,CoinSelectionParams *coin_selection_params)

{
  long lVar1;
  element_type *peVar2;
  COutPoint outpoint;
  optional<CFeeRate> feerate;
  bool bVar3;
  bool can_grind_r;
  int iVar4;
  uint uVar5;
  Chain *pCVar6;
  _Storage<long,_true> nWeight;
  ulong uVar7;
  CWalletTx *pCVar8;
  const_reference pvVar9;
  mapped_type_conflict1 *pmVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  CCoinControl *args;
  undefined8 uVar12;
  pointer outpoint_00;
  bilingual_str *pbVar13;
  long in_FS_OFFSET;
  optional<long> oVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  _Vector_base<COutPoint,_std::allocator<COutPoint>_> local_300;
  _Storage<CFeeRate,_true> local_2e8;
  undefined1 uStack_2e0;
  undefined7 uStack_2df;
  PreSelectedInputs local_2d8;
  COutput output;
  bilingual_str local_200;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  uint32_t local_1a0;
  undefined1 local_198 [96];
  optional<CTxOut> out;
  bilingual_str local_108;
  CTxOut txout;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  map_of_bump_fees;
  PreSelectedInputs result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  result.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result.total_amount = 0;
  result.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  can_grind_r = CWallet::CanGrindR(wallet);
  pCVar6 = CWallet::chain(wallet);
  CCoinControl::ListSelected((vector<COutPoint,_std::allocator<COutPoint>_> *)&output,coin_control);
  (*pCVar6->_vptr_Chain[0x17])(&map_of_bump_fees,pCVar6,&output);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&output);
  CCoinControl::ListSelected
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_300,coin_control);
  uVar12 = 0;
  outpoint_00 = local_300._M_impl.super__Vector_impl_data._M_start;
  do {
    if (outpoint_00 == local_300._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base(&local_300);
      PreSelectedInputs::PreSelectedInputs(&local_2d8,&result);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs>::
      _Variant_storage<1ul,wallet::PreSelectedInputs>
                ((_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs> *)
                 __return_storage_ptr__,&local_2d8);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_2d8);
LAB_0044cf9b:
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&map_of_bump_fees._M_t);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    oVar14 = CCoinControl::GetInputWeight(coin_control,outpoint_00);
    nWeight._M_value =
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)uVar12 >> 8),nWeight._M_value != -1);
    uVar7 = 0xffffffffffffffff;
    if ((oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_engaged & nWeight._M_value != -1) == 1) {
      uVar7 = GetVirtualTransactionSize(nWeight._M_value,0,0);
    }
    CTxOut::CTxOut(&txout);
    pCVar8 = CWallet::GetWalletTx(wallet,(uint256 *)outpoint_00);
    if (pCVar8 == (CWalletTx *)0x0) {
      CCoinControl::GetExternalOutput(&out,coin_control,outpoint_00);
      bVar3 = out.super__Optional_base<CTxOut,_false,_false>._M_payload.
              super__Optional_payload<CTxOut,_true,_false,_false>.
              super__Optional_payload_base<CTxOut>._M_engaged;
      if (out.super__Optional_base<CTxOut,_false,_false>._M_payload.
          super__Optional_payload<CTxOut,_true,_false,_false>.super__Optional_payload_base<CTxOut>.
          _M_engaged == false) {
        _((bilingual_str *)&output,(ConstevalStringLiteral)0x6f7124);
        COutPoint::ToString_abi_cxx11_((string *)local_198,outpoint_00);
        pbVar13 = (bilingual_str *)(local_198 + 0x20);
        tinyformat::format<std::__cxx11::string>
                  (pbVar13,(tinyformat *)&output,(bilingual_str *)local_198,pbVar11);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs> *)
                   __return_storage_ptr__,pbVar13);
        bilingual_str::~bilingual_str(pbVar13);
        std::__cxx11::string::~string((string *)local_198);
        bilingual_str::~bilingual_str((bilingual_str *)&output);
      }
      else {
        CTxOut::operator=(&txout,(CTxOut *)&out);
      }
      std::_Optional_payload_base<CTxOut>::_M_reset((_Optional_payload_base<CTxOut> *)&out);
      if (bVar3 == false) goto LAB_0044cf89;
LAB_0044cd6f:
      if (uVar7 == 0xffffffffffffffff) {
        uVar17 = (undefined4)uStack_1a8;
        uVar18 = (undefined4)((ulong)uStack_1a8 >> 0x20);
        uVar15 = (undefined4)uStack_1b8;
        uVar16 = (undefined4)((ulong)uStack_1b8 >> 0x20);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar15;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar15 >> 8)
        ;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             (char)((uint)uVar15 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             (char)((uint)uVar15 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (undefined1)local_1c0;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_1c0._1_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_1c0._2_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_1c0._3_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_1c0._4_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_1c0._5_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_1c0._6_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_1c0._7_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar16;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             (char)((uint)uVar16 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             (char)((uint)uVar16 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             (char)((uint)uVar16 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (undefined1)local_1b0;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_1b0._1_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_1b0._2_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_1b0._3_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_1b0._4_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_1b0._5_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_1b0._6_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_1b0._7_1_;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar17;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             (char)((uint)uVar17 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (char)((uint)uVar17 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (char)((uint)uVar17 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)uVar18;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (char)((uint)uVar18 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (char)((uint)uVar18 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (char)((uint)uVar18 >> 0x18);
        outpoint.n = local_1a0;
        args = coin_control;
        uVar5 = CalculateMaximumSignedInputSize
                          (&txout,outpoint,
                           &(coin_control->m_external_provider).super_SigningProvider,can_grind_r,
                           coin_control);
        if (uVar5 == 0xffffffff) {
          _((bilingual_str *)&output,(ConstevalStringLiteral)0x6f7144);
          COutPoint::ToString_abi_cxx11_((string *)&out,outpoint_00);
          tinyformat::format<std::__cxx11::string>
                    (&local_200,(tinyformat *)&output,(bilingual_str *)&out,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs>
          ::_Variant_storage<0ul,bilingual_str>
                    ((_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs> *)
                     __return_storage_ptr__,&local_200);
          pbVar13 = &local_200;
          goto LAB_0044cf6a;
        }
        uVar7 = (ulong)uVar5;
      }
    }
    else {
      peVar2 = (pCVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000028;
      if ((ulong)(((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28) <= (ulong)outpoint_00->n) {
        _((bilingual_str *)&output,(ConstevalStringLiteral)0x6f7106);
        COutPoint::ToString_abi_cxx11_((string *)&out,outpoint_00);
        tinyformat::format<std::__cxx11::string>
                  (&local_108,(tinyformat *)&output,(bilingual_str *)&out,pbVar11);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::PreSelectedInputs> *)
                   __return_storage_ptr__,&local_108);
        pbVar13 = &local_108;
LAB_0044cf6a:
        bilingual_str::~bilingual_str(pbVar13);
        std::__cxx11::string::~string((string *)&out);
        bilingual_str::~bilingual_str((bilingual_str *)&output);
LAB_0044cf89:
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&txout.scriptPubKey.super_CScriptBase);
        std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base(&local_300);
        goto LAB_0044cf9b;
      }
      pvVar9 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&peVar2->vout,(ulong)outpoint_00->n)
      ;
      CTxOut::operator=(&txout,pvVar9);
      if (uVar7 == 0xffffffffffffffff) {
        iVar4 = CalculateMaximumSignedInputSize(&txout,wallet,coin_control);
        uVar7 = (ulong)iVar4;
        goto LAB_0044cd6f;
      }
    }
    local_2e8 = (_Storage<CFeeRate,_true>)(coin_selection_params->m_effective_feerate).nSatoshisPerK
    ;
    uStack_2e0 = 1;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ = uStack_2df;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged = true;
    uVar12 = 0;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload = local_2e8;
    COutput::COutput(&output,outpoint_00,&txout,0,(int)uVar7,true,true,true,0,false,feerate);
    pmVar10 = std::
              map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              ::at(&map_of_bump_fees,&output.outpoint);
    COutput::ApplyBumpFee(&output,*pmVar10);
    PreSelectedInputs::Insert(&result,&output,coin_selection_params->m_subtract_fee_outputs);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&output.txout.scriptPubKey.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&txout.scriptPubKey.super_CScriptBase);
    outpoint_00 = outpoint_00 + 1;
  } while( true );
}

Assistant:

util::Result<PreSelectedInputs> FetchSelectedInputs(const CWallet& wallet, const CCoinControl& coin_control,
                                            const CoinSelectionParams& coin_selection_params)
{
    PreSelectedInputs result;
    const bool can_grind_r = wallet.CanGrindR();
    std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(coin_control.ListSelected(), coin_selection_params.m_effective_feerate);
    for (const COutPoint& outpoint : coin_control.ListSelected()) {
        int64_t input_bytes = coin_control.GetInputWeight(outpoint).value_or(-1);
        if (input_bytes != -1) {
            input_bytes = GetVirtualTransactionSize(input_bytes, 0, 0);
        }
        CTxOut txout;
        if (auto ptr_wtx = wallet.GetWalletTx(outpoint.hash)) {
            // Clearly invalid input, fail
            if (ptr_wtx->tx->vout.size() <= outpoint.n) {
                return util::Error{strprintf(_("Invalid pre-selected input %s"), outpoint.ToString())};
            }
            txout = ptr_wtx->tx->vout.at(outpoint.n);
            if (input_bytes == -1) {
                input_bytes = CalculateMaximumSignedInputSize(txout, &wallet, &coin_control);
            }
        } else {
            // The input is external. We did not find the tx in mapWallet.
            const auto out{coin_control.GetExternalOutput(outpoint)};
            if (!out) {
                return util::Error{strprintf(_("Not found pre-selected input %s"), outpoint.ToString())};
            }

            txout = *out;
        }

        if (input_bytes == -1) {
            input_bytes = CalculateMaximumSignedInputSize(txout, outpoint, &coin_control.m_external_provider, can_grind_r, &coin_control);
        }

        if (input_bytes == -1) {
            return util::Error{strprintf(_("Not solvable pre-selected input %s"), outpoint.ToString())}; // Not solvable, can't estimate size for fee
        }

        /* Set some defaults for depth, spendable, solvable, safe, time, and from_me as these don't matter for preset inputs since no selection is being done. */
        COutput output(outpoint, txout, /*depth=*/ 0, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, coin_selection_params.m_effective_feerate);
        output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
        result.Insert(output, coin_selection_params.m_subtract_fee_outputs);
    }
    return result;
}